

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

PyObject * get_dict(PyObject *op,void *param_2)

{
  long *plVar1;
  long lVar2;
  PyObject **dict;
  void *param_1_local;
  PyObject *op_local;
  
  plVar1 = (long *)_PyObject_GetDictPtr(op);
  if (*plVar1 == 0) {
    lVar2 = PyDict_New();
    *plVar1 = lVar2;
  }
  _Py_XINCREF((PyObject *)*plVar1);
  return (PyObject *)*plVar1;
}

Assistant:

inline PyObject *get_dict(PyObject *op, void *) {
    PyObject *&dict = *_PyObject_GetDictPtr(op);
    if (!dict)
        dict = PyDict_New();
    Py_XINCREF(dict);
    return dict;
}